

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O1

Validity * __thiscall kj::TestRunner::run(Validity *__return_storage_ptr__,TestRunner *this)

{
  ProcessContext *pPVar1;
  Runnable RVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  TestRunner *in_RCX;
  TestRunner *pTVar8;
  size_t i;
  size_t sVar9;
  char *pcVar10;
  _func_int **pp_Var11;
  size_t sVar12;
  bool currentFailed;
  uint failCount;
  uint passCount;
  String name;
  String message;
  char **in_stack_fffffffffffffca8;
  char local_349;
  int local_348;
  int local_344;
  long local_340;
  String local_338;
  Runnable local_318;
  TestRunner *pTStack_310;
  ArrayDisposer *local_308;
  char *local_300;
  undefined1 local_2f8 [16];
  ArrayDisposer *local_2e8;
  ArrayDisposer *pAStack_2e0;
  char *local_2d8;
  undefined8 uStack_2d0;
  char *local_2c8;
  size_t local_2c0;
  ArrayDisposer *pAStack_2b8;
  Disposer *local_2b0;
  Context *pCStack_2a8;
  undefined1 local_2a0 [264];
  Maybe<kj::Exception> local_198;
  
  if ((anonymous_namespace)::testCasesHead == 0) {
    heapString((String *)local_2f8,"no tests were declared",0x16);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = (char *)local_2f8._0_8_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_2f8._8_8_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer = local_2e8;
    return __return_storage_ptr__;
  }
  pcVar10 = *(char **)((anonymous_namespace)::testCasesHead + 8);
  sVar5 = strlen(pcVar10);
  for (lVar6 = (anonymous_namespace)::testCasesHead; lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x20)) {
    sVar12 = sVar5;
    if (sVar5 != 0) {
      in_RCX = *(TestRunner **)(lVar6 + 8);
      sVar9 = 0;
      do {
        sVar12 = sVar9;
        if (*(char *)((long)&in_RCX->context + sVar9) != pcVar10[sVar9]) break;
        sVar9 = sVar9 + 1;
        sVar12 = sVar5;
      } while (sVar5 != sVar9);
    }
    sVar5 = sVar12;
  }
  if (sVar5 != 0) {
    do {
      if ((pcVar10[sVar5 - 1] == '/') || (pcVar10[sVar5 - 1] == '\\')) goto LAB_002a5942;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    sVar5 = 0;
  }
LAB_002a5942:
  local_344 = 0;
  local_348 = 0;
  for (local_340 = (anonymous_namespace)::testCasesHead; local_340 != 0;
      local_340 = *(long *)(local_340 + 0x20)) {
    if ((this->hasFilter != true) || (*(char *)(local_340 + 0x30) == '\x01')) {
      local_2f8._0_8_ = *(long *)(local_340 + 8) + sVar5;
      local_198.ptr._1_7_ = SUB87((ulong)local_198.ptr._0_8_ >> 8,0);
      local_198.ptr.isSet = true;
      str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
                (&local_338,(kj *)local_2f8,(char **)&local_198,(char *)(local_340 + 0x10),
                 (uint *)0x322a4d,(char (*) [3])(local_340 + 0x18),in_stack_fffffffffffffca8);
      pcVar10 = (char *)((long)(ProcessContext **)local_338.content.size_ +
                        (ulong)((TestRunner *)local_338.content.size_ == (TestRunner *)0x0));
      in_RCX = (TestRunner *)0x9;
      write(this,2,"[ TEST ]",9);
      if (this->listOnly == false) {
        local_349 = '\x01';
        lVar6 = std::chrono::_V2::steady_clock::now();
        local_318._vptr_Runnable = (_func_int **)&PTR_run_00385328;
        local_308 = (ArrayDisposer *)&local_340;
        local_300 = &local_349;
        pTStack_310 = this;
        _::runCatchingExceptions(&local_198,&local_318);
        local_2f8[0] = (kj)local_198.ptr.isSet;
        if (local_198.ptr.isSet == true) {
          local_2f8._8_8_ = local_198.ptr.field_1.value.ownFile.content.ptr;
          local_2e8 = (ArrayDisposer *)local_198.ptr.field_1.value.ownFile.content.size_;
          pAStack_2e0 = local_198.ptr.field_1.value.ownFile.content.disposer;
          local_198.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
          local_198.ptr.field_1.value.ownFile.content.size_ = 0;
          local_2d8 = local_198.ptr.field_1.value.file;
          uStack_2d0 = local_198.ptr.field_1._32_8_;
          local_2c8 = local_198.ptr.field_1.value.description.content.ptr;
          local_2c0 = local_198.ptr.field_1.value.description.content.size_;
          pAStack_2b8 = local_198.ptr.field_1.value.description.content.disposer;
          local_198.ptr.field_1.value.description.content.ptr = (char *)0x0;
          local_198.ptr.field_1.value.description.content.size_ = 0;
          local_2b0 = local_198.ptr.field_1.value.context.ptr.disposer;
          pCStack_2a8 = local_198.ptr.field_1.value.context.ptr.ptr;
          local_198.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
          memcpy(local_2a0,(undefined1 *)((long)&local_198.ptr.field_1.value + 0x50),0x104);
          Exception::~Exception((Exception *)&local_198.ptr.field_1);
        }
        if (local_2f8[0] == (kj)0x1) {
          pPVar1 = this->context;
          kj::operator*(&local_198,local_2f8 + 8);
          local_318._vptr_Runnable = (_func_int **)local_198.ptr._0_8_;
          pTStack_310 = (TestRunner *)local_198.ptr.field_1.value.ownFile.content.ptr;
          local_308 = (ArrayDisposer *)local_198.ptr.field_1.value.ownFile.content.size_;
          pp_Var11 = (_func_int **)local_198.ptr._0_8_;
          if ((TestRunner *)local_198.ptr.field_1.value.ownFile.content.ptr == (TestRunner *)0x0) {
            pp_Var11 = (_func_int **)0x324321;
          }
          (*pPVar1->_vptr_ProcessContext[3])
                    (pPVar1,pp_Var11,
                     local_198.ptr.field_1.value.ownFile.content.ptr +
                     ((TestRunner *)local_198.ptr.field_1.value.ownFile.content.ptr ==
                     (TestRunner *)0x0));
          pTVar8 = pTStack_310;
          RVar2._vptr_Runnable = local_318._vptr_Runnable;
          if (local_318._vptr_Runnable != (_func_int **)0x0) {
            local_318._vptr_Runnable = (_func_int **)0x0;
            pTStack_310 = (TestRunner *)0x0;
            pcVar10 = (char *)0x0;
            (*(code *)**(undefined8 **)local_308)(local_308,RVar2._vptr_Runnable,1,pTVar8,pTVar8);
          }
        }
        if (local_2f8[0] == (kj)0x1) {
          Exception::~Exception((Exception *)(local_2f8 + 8));
        }
        lVar7 = std::chrono::_V2::steady_clock::now();
        local_198.ptr._0_8_ = (lVar7 - lVar6) / 1000;
        str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
                  ((String *)local_2f8,(kj *)&local_338,(String *)" (",(char (*) [3])&local_198,
                   (long *)anon_var_dwarf_369825,(char (*) [6])pcVar10);
        if (local_349 == '\x01') {
          in_RCX = (TestRunner *)0x9;
          write(this,0,"[ FAIL ]",9);
          local_348 = local_348 + 1;
        }
        else {
          in_RCX = (TestRunner *)0x9;
          write(this,1,"[ PASS ]",9);
          local_344 = local_344 + 1;
        }
        pTVar8 = (TestRunner *)local_2f8._8_8_;
        uVar3 = local_2f8._0_8_;
        if ((char *)local_2f8._0_8_ != (char *)0x0) {
          local_2f8._0_8_ = (char *)0x0;
          local_2f8._8_8_ = (TestRunner *)0x0;
          (*(code *)**(undefined8 **)local_2e8)(local_2e8,uVar3,1,pTVar8,pTVar8,0);
          in_RCX = pTVar8;
        }
      }
      pTVar8 = (TestRunner *)local_338.content.size_;
      pcVar10 = local_338.content.ptr;
      if (local_338.content.ptr != (char *)0x0) {
        local_338.content.ptr = (char *)0x0;
        local_338.content.size_ = 0;
        (*(code *)**(undefined8 **)local_338.content.disposer)
                  (local_338.content.disposer,pcVar10,1,pTVar8,pTVar8,0);
        in_RCX = pTVar8;
      }
    }
  }
  if (local_344 != 0) {
    str<unsigned_int&,char_const(&)[16]>
              ((String *)local_2f8,(kj *)&local_344,(uint *)" test(s) passed",(char (*) [16])in_RCX)
    ;
    pcVar10 = "";
    if ((TestRunner *)local_2f8._8_8_ != (TestRunner *)0x0) {
      pcVar10 = (char *)local_2f8._0_8_;
    }
    in_RCX = (TestRunner *)
             ((long)(ProcessContext **)local_2f8._8_8_ +
             (ulong)((TestRunner *)local_2f8._8_8_ == (TestRunner *)0x0));
    write(this,1,pcVar10,(size_t)in_RCX);
    String::~String((String *)local_2f8);
  }
  if (local_348 != 0) {
    str<unsigned_int&,char_const(&)[16]>
              ((String *)local_2f8,(kj *)&local_348,(uint *)" test(s) failed",(char (*) [16])in_RCX)
    ;
    pcVar10 = "";
    if ((TestRunner *)local_2f8._8_8_ != (TestRunner *)0x0) {
      pcVar10 = (char *)local_2f8._0_8_;
    }
    write(this,0,pcVar10,
          (size_t)((long)(ProcessContext **)local_2f8._8_8_ +
                  (ulong)((TestRunner *)local_2f8._8_8_ == (TestRunner *)0x0)));
    String::~String((String *)local_2f8);
  }
  iVar4 = (*this->context->_vptr_ProcessContext[1])();
  __clang_call_terminate(iVar4);
}

Assistant:

MainBuilder::Validity run() {
    if (testCasesHead == nullptr) {
      return "no tests were declared";
    }

    // Find the common path prefix of all filenames, so we can strip it off.
    ArrayPtr<const char> commonPrefix = StringPtr(testCasesHead->file);
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      for (size_t i: kj::indices(commonPrefix)) {
        if (testCase->file[i] != commonPrefix[i]) {
          commonPrefix = commonPrefix.slice(0, i);
          break;
        }
      }
    }

    // Back off the prefix to the last '/'.
    while (commonPrefix.size() > 0 && commonPrefix.back() != '/' && commonPrefix.back() != '\\') {
      commonPrefix = commonPrefix.slice(0, commonPrefix.size() - 1);
    }

    // Run the testts.
    uint passCount = 0;
    uint failCount = 0;
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!hasFilter || testCase->matchedFilter) {
        auto name = kj::str(testCase->file + commonPrefix.size(), ':', testCase->line,
                            ": ", testCase->description);

        write(BLUE, "[ TEST ]", name);

        if (!listOnly) {
          bool currentFailed = true;
          auto start = readClock();
          KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
            TestExceptionCallback exceptionCallback(context);
            testCase->run();
            currentFailed = exceptionCallback.failed();
          })) {
            context.error(kj::str(*exception));
          }
          auto end = readClock();

          auto message = kj::str(name, " (", (end - start) / kj::MICROSECONDS, " μs)");

          if (currentFailed) {
            write(RED, "[ FAIL ]", message);
            ++failCount;
          } else {
            write(GREEN, "[ PASS ]", message);
            ++passCount;
          }
        }
      }
    }

    if (passCount > 0) write(GREEN, kj::str(passCount, " test(s) passed"), "");
    if (failCount > 0) write(RED, kj::str(failCount, " test(s) failed"), "");
    context.exit();

    KJ_UNREACHABLE;
  }